

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void destroy_section(ALLEGRO_CONFIG_SECTION *s)

{
  long in_RDI;
  ALLEGRO_CONFIG_ENTRY *tmp;
  ALLEGRO_CONFIG_ENTRY *e;
  char *in_stack_ffffffffffffffe8;
  char *file;
  int line;
  
  file = *(char **)(in_RDI + 8);
  while (line = (int)((ulong)in_RDI >> 0x20), file != (char *)0x0) {
    in_stack_ffffffffffffffe8 = *(char **)(file + 0x20);
    destroy_entry((ALLEGRO_CONFIG_ENTRY *)0x14c1d6);
    file = in_stack_ffffffffffffffe8;
  }
  al_ustr_free((ALLEGRO_USTR *)0x14c1ee);
  _al_aa_free((Aatree *)0x14c1fc);
  al_free_with_context(tmp,line,file,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void destroy_section(ALLEGRO_CONFIG_SECTION *s)
{
   ALLEGRO_CONFIG_ENTRY *e = s->head;
   while (e) {
      ALLEGRO_CONFIG_ENTRY *tmp = e->next;
      destroy_entry(e);
      e = tmp;
   }
   al_ustr_free(s->name);
   _al_aa_free(s->tree);
   al_free(s);
}